

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

FloatTexture
pbrt::FloatTexture::Create
          (string *name,Transform *renderFromTexture,TextureParameterDictionary *parameters,
          FileLoc *loc,Allocator alloc,bool gpu)

{
  Allocator alloc_00;
  byte bVar1;
  bool bVar2;
  Transform *in_RCX;
  Allocator in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  TextureParameterDictionary *in_R8;
  FileLoc *in_R9;
  long *in_FS_OFFSET;
  Transform *unaff_retaddr;
  byte in_stack_00000008;
  undefined7 in_stack_00000009;
  TextureParameterDictionary *in_stack_00000010;
  Transform *in_stack_00000018;
  Allocator in_stack_00000020;
  FileLoc *in_stack_00000050;
  TextureParameterDictionary *in_stack_00000058;
  Transform *in_stack_00000060;
  Allocator in_stack_00000068;
  FileLoc *in_stack_00000078;
  TextureParameterDictionary *in_stack_00000080;
  Transform *in_stack_00000088;
  Allocator in_stack_00000090;
  FloatTexture *tex;
  Allocator in_stack_00000128;
  FileLoc *in_stack_000002d8;
  TextureParameterDictionary *in_stack_000002e0;
  Transform *in_stack_000002e8;
  Allocator in_stack_000002f0;
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatDirectionMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::GPUFloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  __lhs;
  Transform *in_stack_fffffffffffffee8;
  Allocator in_stack_fffffffffffffef0;
  Transform *in_stack_fffffffffffffef8;
  Allocator in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  FileLoc *in_stack_ffffffffffffff18;
  FileLoc *in_stack_ffffffffffffff20;
  FileLoc *in_stack_ffffffffffffff38;
  TextureParameterDictionary *in_stack_ffffffffffffff40;
  Transform *in_stack_ffffffffffffff48;
  Allocator in_stack_ffffffffffffff50;
  FileLoc *in_stack_ffffffffffffff88;
  TextureParameterDictionary *in_stack_ffffffffffffff90;
  Transform *in_stack_ffffffffffffff98;
  Allocator in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *parameters_00;
  
  bVar1 = in_stack_00000008 & 1;
  __lhs.bits = (uint64_t)in_RDI;
  parameters_00 = in_RDI;
  FloatTexture((FloatTexture *)0x5cc558);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __lhs.bits,(char *)in_RDI);
  if (bVar2) {
    FloatConstantTexture::Create
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff50);
    TaggedPointer<pbrt::FloatConstantTexture>
              ((FloatTexture *)__lhs.bits,(FloatConstantTexture *)in_RDI);
    operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs.bits,(char *)in_RDI);
    if (bVar2) {
      FloatScaledTexture::Create
                (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000068);
      operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs.bits,(char *)in_RDI);
      if (bVar2) {
        FloatMixTexture::Create
                  (in_RCX,in_R8,(FileLoc *)CONCAT17(bVar1,in_stack_ffffffffffffffc8),in_RDX);
        TaggedPointer<pbrt::FloatMixTexture>((FloatTexture *)__lhs.bits,(FloatMixTexture *)in_RDI);
        operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs.bits,(char *)in_RDI);
        if (bVar2) {
          FloatDirectionMixTexture::Create
                    (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000090);
          TaggedPointer<pbrt::FloatDirectionMixTexture>
                    ((FloatTexture *)__lhs.bits,(FloatDirectionMixTexture *)in_RDI);
          operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs.bits,(char *)in_RDI);
          if (bVar2) {
            FloatBilerpTexture::Create
                      (in_stack_00000018,in_stack_00000010,
                       (FileLoc *)CONCAT71(in_stack_00000009,in_stack_00000008),in_stack_00000020);
            TaggedPointer<pbrt::FloatBilerpTexture>
                      ((FloatTexture *)__lhs.bits,(FloatBilerpTexture *)in_RDI);
            operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs.bits,(char *)in_RDI);
            if (bVar2) {
              if ((bVar1 & 1) == 0) {
                FloatImageTexture::Create
                          (in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,in_stack_000002f0);
                TaggedPointer<pbrt::FloatImageTexture>
                          ((FloatTexture *)__lhs.bits,(FloatImageTexture *)in_RDI);
                operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
              }
              else {
                GPUFloatImageTexture::Create
                          (in_stack_fffffffffffffee8,(TextureParameterDictionary *)__lhs.bits,
                           (FileLoc *)in_RDI,in_stack_fffffffffffffef0);
                TaggedPointer<pbrt::GPUFloatImageTexture>
                          ((FloatTexture *)__lhs.bits,(GPUFloatImageTexture *)in_RDI);
                operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
              }
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs.bits,(char *)in_RDI);
              if (bVar2) {
                alloc_00.memoryResource._1_7_ = in_stack_00000009;
                alloc_00.memoryResource._0_1_ = in_stack_00000008;
                FloatCheckerboardTexture::Create
                          (unaff_retaddr,(TextureParameterDictionary *)parameters_00,in_R9,alloc_00)
                ;
                TaggedPointer<pbrt::FloatCheckerboardTexture>
                          ((FloatTexture *)__lhs.bits,(FloatCheckerboardTexture *)in_RDI);
                operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs.bits,(char *)in_RDI);
                if (bVar2) {
                  FloatDotsTexture::Create
                            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                             in_stack_ffffffffffffff88,in_stack_ffffffffffffffa0);
                  TaggedPointer<pbrt::FloatDotsTexture>
                            ((FloatTexture *)__lhs.bits,(FloatDotsTexture *)in_RDI);
                  operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs.bits,(char *)in_RDI);
                  if (bVar2) {
                    FBmTexture::Create(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                       in_stack_ffffffffffffff88,in_stack_ffffffffffffffa0);
                    TaggedPointer<pbrt::FBmTexture>((FloatTexture *)__lhs.bits,(FBmTexture *)in_RDI)
                    ;
                    operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__lhs.bits,(char *)in_RDI);
                    if (bVar2) {
                      WrinkledTexture::Create
                                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff88,in_stack_ffffffffffffffa0);
                      TaggedPointer<pbrt::WrinkledTexture>
                                ((FloatTexture *)__lhs.bits,(WrinkledTexture *)in_RDI);
                      operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
                      in_stack_ffffffffffffff18 = in_R9;
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)__lhs.bits,(char *)in_RDI);
                      if (bVar2) {
                        WindyTexture::Create
                                  (in_stack_fffffffffffffef8,
                                   (TextureParameterDictionary *)
                                   in_stack_fffffffffffffef0.memoryResource,
                                   (FileLoc *)in_stack_fffffffffffffee8,in_stack_ffffffffffffff00);
                        TaggedPointer<pbrt::WindyTexture>
                                  ((FloatTexture *)__lhs.bits,(WindyTexture *)in_RDI);
                        operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)__lhs.bits,(char *)in_RDI);
                        if (!bVar2) {
                          ErrorExit<std::__cxx11::string_const&>
                                    (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
                                     in_stack_ffffffffffffff10);
                        }
                        if ((bVar1 & 1) == 0) {
                          FloatPtexTexture::Create
                                    (in_stack_00000088,in_stack_00000080,in_stack_00000078,
                                     in_stack_00000090);
                          TaggedPointer<pbrt::FloatPtexTexture>
                                    ((FloatTexture *)__lhs.bits,(FloatPtexTexture *)in_RDI);
                          operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
                        }
                        else {
                          GPUFloatPtexTexture::Create
                                    ((Transform *)tex,
                                     (TextureParameterDictionary *)alloc.memoryResource,
                                     (FileLoc *)name,in_stack_00000128);
                          TaggedPointer<pbrt::GPUFloatPtexTexture>
                                    ((FloatTexture *)__lhs.bits,(GPUFloatPtexTexture *)in_RDI);
                          operator=((FloatTexture *)__lhs.bits,(FloatTexture *)in_RDI);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar2 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI);
  if (bVar2) {
    *(long *)(*in_FS_OFFSET + -0x488) = *(long *)(*in_FS_OFFSET + -0x488) + 1;
    TextureParameterDictionary::ReportUnused((TextureParameterDictionary *)0x5ccbc1);
    return (FloatTexture)
           (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatDirectionMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::GPUFloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
            )__lhs.bits;
  }
  ErrorExit<std::__cxx11::string_const&>
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
}

Assistant:

FloatTexture FloatTexture::Create(const std::string &name,
                                  const Transform &renderFromTexture,
                                  const TextureParameterDictionary &parameters,
                                  const FileLoc *loc, Allocator alloc, bool gpu) {
    FloatTexture tex;
    if (name == "constant")
        tex = FloatConstantTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "scale")
        tex = FloatScaledTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "mix")
        tex = FloatMixTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "directionmix")
        tex = FloatDirectionMixTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "bilerp")
        tex = FloatBilerpTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "imagemap") {
        if (gpu)
            tex = GPUFloatImageTexture::Create(renderFromTexture, parameters, loc, alloc);
        else
            tex = FloatImageTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else if (name == "checkerboard")
        tex = FloatCheckerboardTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "dots")
        tex = FloatDotsTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "fbm")
        tex = FBmTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "wrinkled")
        tex = WrinkledTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "windy")
        tex = WindyTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "ptex") {
        if (gpu)
            tex = GPUFloatPtexTexture::Create(renderFromTexture, parameters, loc, alloc);
        else
            tex = FloatPtexTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else
        ErrorExit(loc, "%s: float texture type unknown.", name);

    if (!tex)
        ErrorExit(loc, "%s: unable to create texture.", name);

    ++nTextures;

    parameters.ReportUnused();
    return tex;
}